

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentParser.hpp
# Opt level: O2

ArgFlag * __thiscall
Utils::ArgumentParser::make_flag
          (ArgumentParser *this,string *name,string *description,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *flg)

{
  pointer pbVar1;
  iterator iVar2;
  ArgFlag *this_00;
  pointer pbVar3;
  ArgFlag *f;
  _Base_ptr local_80;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ArgFlag_*>
  local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> i;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this,name);
  if ((_Rb_tree_header *)iVar2._M_node != &(this->used_name)._M_t._M_impl.super__Rb_tree_header) {
    __assert_fail("used_name.find(name) == used_name.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/GiuMaz[P]satyricon/include/ArgumentParser.hpp"
                  ,0x120,
                  "ArgFlag &Utils::ArgumentParser::make_flag(const std::string &, const std::string &, const std::vector<std::string> &)"
                 );
  }
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this,name);
  this_00 = (ArgFlag *)operator_new(0x68);
  ArgFlag::ArgFlag(this_00,name,description,flg);
  f = this_00;
  std::vector<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>::push_back(&this->flags,&f);
  pbVar3 = (flg->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (flg->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_80 = &(this->used_identifier)._M_t._M_impl.super__Rb_tree_header._M_header;
  while( true ) {
    if (pbVar3 == pbVar1) {
      return f;
    }
    std::__cxx11::string::string((string *)&i,(string *)pbVar3);
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->used_identifier)._M_t,&i);
    if (iVar2._M_node != local_80) break;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->used_identifier,&i);
    std::__cxx11::string::string((string *)&local_78,(string *)&i);
    local_78.second = f;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Utils::ArgObject*>,std::_Select1st<std::pair<std::__cxx11::string_const,Utils::ArgObject*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Utils::ArgObject*>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,Utils::ArgFlag*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Utils::ArgObject*>,std::_Select1st<std::pair<std::__cxx11::string_const,Utils::ArgObject*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Utils::ArgObject*>>>
                *)&this->flag_mapping,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&i);
    pbVar3 = pbVar3 + 1;
  }
  __assert_fail("used_identifier.find(i) == used_identifier.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/GiuMaz[P]satyricon/include/ArgumentParser.hpp"
                ,0x127,
                "ArgFlag &Utils::ArgumentParser::make_flag(const std::string &, const std::string &, const std::vector<std::string> &)"
               );
}

Assistant:

inline ArgFlag& ArgumentParser::make_flag( const std::string& name,
        const std::string& description, const std::vector<std::string>& flg) {
    assert(used_name.find(name) == used_name.end());
    used_name.insert(name);

    auto f = new ArgFlag(name,description,flg);
    flags.push_back(f);

    for ( auto i : flg ) {
        assert(used_identifier.find(i) == used_identifier.end());
        used_identifier.insert(i);

        flag_mapping.insert( std::make_pair(i, f));
    }

    return *f;
}